

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Join_Cmd.cpp
# Opt level: O3

bool __thiscall SRUP_MSG_JOIN_CMD::device_ID(SRUP_MSG_JOIN_CMD *this,uint64_t *device_id)

{
  uint64_t *puVar1;
  
  if (this->m_device_id != (uint64_t *)0x0) {
    operator_delete(this->m_device_id);
  }
  puVar1 = (uint64_t *)operator_new(8);
  this->m_device_id = puVar1;
  *puVar1 = *device_id;
  return true;
}

Assistant:

bool SRUP_MSG_JOIN_CMD::device_ID(const uint64_t* device_id)
{
    try
    {
        if (m_device_id != nullptr)
            delete(m_device_id);

        m_device_id = new uint64_t;
        std::memcpy(m_device_id, device_id, sizeof(uint64_t));
    }
    catch (...)
    {
        m_device_id = nullptr;
        return false;
    }
    return true;
}